

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

void google::protobuf::compiler::ruby::GenerateOneof(OneofDescriptor *oneof,Printer *printer)

{
  int i;
  long lVar1;
  
  io::Printer::Print(printer,"oneof :$name$ do\n","name",*(string **)oneof);
  io::Printer::Indent(printer);
  for (lVar1 = 0; lVar1 < *(int *)(oneof + 0x1c); lVar1 = lVar1 + 1) {
    GenerateField(*(FieldDescriptor **)(*(long *)(oneof + 0x20) + lVar1 * 8),printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"end\n");
  return;
}

Assistant:

void GenerateOneof(const google::protobuf::OneofDescriptor* oneof,
                   google::protobuf::io::Printer* printer) {
  printer->Print(
      "oneof :$name$ do\n",
      "name", oneof->name());
  printer->Indent();

  for (int i = 0; i < oneof->field_count(); i++) {
    const FieldDescriptor* field = oneof->field(i);
    GenerateField(field, printer);
  }

  printer->Outdent();
  printer->Print("end\n");
}